

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

CTX_PTR CreateSuccessors(CPpmd7 *p,Bool skip)

{
  CPpmd_State *pCVar1;
  Byte BVar2;
  byte bVar3;
  uint uVar4;
  CPpmd_State *pCVar5;
  Byte *pBVar6;
  uint uVar7;
  CTX_PTR pCVar8;
  Byte *pBVar9;
  Byte *pBVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  CPpmd_State *pCVar14;
  uint uVar15;
  ulong in_R9;
  CPpmd_State *pCVar16;
  ulong uVar17;
  CTX_PTR pCVar18;
  CPpmd_State *ps [64];
  undefined8 uStack_240;
  CPpmd_State *local_238 [65];
  
  pCVar8 = p->MinContext;
  pCVar5 = p->FoundState;
  uVar4 = *(uint *)&pCVar5->SuccessorLow;
  if (skip == 0) {
    local_238[0] = pCVar5;
  }
  uVar15 = (uint)(skip == 0);
  uVar7 = pCVar8->Suffix;
  pBVar9 = p->Base;
  do {
    if (uVar7 == 0) {
LAB_001852bc:
      BVar2 = pBVar9[uVar4];
      if (pCVar8->NumStats == 1) {
        uVar17 = CONCAT71((int7)(in_R9 >> 8),*(undefined1 *)((long)&pCVar8->SummFreq + 1));
      }
      else {
        pBVar6 = pBVar9 + pCVar8->Stats;
        do {
          pBVar10 = pBVar6;
          pBVar6 = pBVar10 + 6;
        } while (*pBVar10 != BVar2);
        bVar3 = pBVar10[1];
        uVar13 = ((uint)pCVar8->SummFreq - ((uint)pCVar8->NumStats + (uint)bVar3)) + 1;
        uVar7 = (uint)bVar3 * 2 - 2;
        if (uVar13 < uVar7) {
          uVar17 = (ulong)((uVar7 + uVar13 * 3) - 1) / (ulong)(uVar13 * 2);
        }
        else {
          uVar17 = (ulong)(uVar13 < (bVar3 - 1) * 5);
        }
        uVar17 = CONCAT71((int7)(uVar17 >> 8),(char)uVar17 + '\x01');
      }
      if (uVar15 != 0) {
        uVar12 = (ulong)uVar15;
        uStack_240._4_4_ = (uint)uVar17;
        pCVar18 = pCVar8;
        do {
          if (p->HiUnit == p->LoUnit) {
            uVar11 = (ulong)p->FreeList[0];
            if (uVar11 == 0) {
              pCVar8 = (CTX_PTR)AllocUnitsRare(p,0);
              uVar17 = (ulong)uStack_240._4_4_;
              if (pCVar8 == (CTX_PTR)0x0) {
                return (CTX_PTR)0x0;
              }
            }
            else {
              pCVar8 = (CTX_PTR)(pBVar9 + uVar11);
              p->FreeList[0] = *(CPpmd_Void_Ref *)(pBVar9 + uVar11);
            }
          }
          else {
            pCVar8 = (CTX_PTR)(p->HiUnit + -0xc);
            p->HiUnit = (Byte *)pCVar8;
          }
          pCVar8->NumStats = 1;
          *(Byte *)&pCVar8->SummFreq = BVar2;
          *(char *)((long)&pCVar8->SummFreq + 1) = (char)uVar17;
          pCVar8->Stats = uVar4 + 1;
          pBVar9 = p->Base;
          pCVar8->Suffix = (int)pCVar18 - (int)pBVar9;
          *(int *)((&uStack_240)[uVar12] + 2) = (int)pCVar8 - (int)pBVar9;
          uVar12 = uVar12 - 1;
          pCVar18 = pCVar8;
        } while (uVar12 != 0);
      }
      return pCVar8;
    }
    pCVar8 = (CTX_PTR)(pBVar9 + uVar7);
    if (*(short *)(pBVar9 + uVar7) == 1) {
      pCVar14 = (CPpmd_State *)&pCVar8->SummFreq;
    }
    else {
      pCVar16 = (CPpmd_State *)(pBVar9 + ((ulong)pCVar8->Stats - 6));
      do {
        pCVar14 = pCVar16 + 1;
        pCVar1 = pCVar16 + 1;
        pCVar16 = pCVar14;
      } while ((Byte)*(CPpmd7_Context_Ref *)&pCVar1->Symbol != pCVar5->Symbol);
    }
    uVar7 = *(uint *)&pCVar14->SuccessorLow;
    in_R9 = (ulong)uVar7;
    if (uVar7 != uVar4) {
      pCVar8 = (CTX_PTR)(pBVar9 + uVar7);
      if (uVar15 == 0) {
        return pCVar8;
      }
      goto LAB_001852bc;
    }
    in_R9 = (ulong)uVar15;
    uVar15 = uVar15 + 1;
    local_238[in_R9] = pCVar14;
    uVar7 = pCVar8->Suffix;
  } while( true );
}

Assistant:

static CTX_PTR CreateSuccessors(CPpmd7 *p, Bool skip)
{
  CPpmd_State upState;
  CTX_PTR c = p->MinContext;
  CPpmd_Byte_Ref upBranch = (CPpmd_Byte_Ref)SUCCESSOR(p->FoundState);
  CPpmd_State *ps[PPMD7_MAX_ORDER];
  unsigned numPs = 0;
  
  if (!skip)
    ps[numPs++] = p->FoundState;
  
  while (c->Suffix)
  {
    CPpmd_Void_Ref successor;
    CPpmd_State *s;
    c = SUFFIX(c);
    if (c->NumStats != 1)
    {
      for (s = STATS(c); s->Symbol != p->FoundState->Symbol; s++);
    }
    else
      s = ONE_STATE(c);
    successor = SUCCESSOR(s);
    if (successor != upBranch)
    {
      c = CTX(successor);
      if (numPs == 0)
        return c;
      break;
    }
    ps[numPs++] = s;
  }
  
  upState.Symbol = *(const Byte *)Ppmd7_GetPtr(p, upBranch);
  SetSuccessor(&upState, upBranch + 1);
  
  if (c->NumStats == 1)
    upState.Freq = ONE_STATE(c)->Freq;
  else
  {
    UInt32 cf, s0;
    CPpmd_State *s;
    for (s = STATS(c); s->Symbol != upState.Symbol; s++);
    cf = s->Freq - 1;
    s0 = c->SummFreq - c->NumStats - cf;
    upState.Freq = (Byte)(1 + ((2 * cf <= s0) ? (5 * cf > s0) : ((2 * cf + 3 * s0 - 1) / (2 * s0))));
  }

  while (numPs != 0)
  {
    /* Create Child */
    CTX_PTR c1; /* = AllocContext(p); */
    if (p->HiUnit != p->LoUnit)
      c1 = (CTX_PTR)(p->HiUnit -= UNIT_SIZE);
    else if (p->FreeList[0] != 0)
      c1 = (CTX_PTR)RemoveNode(p, 0);
    else
    {
      c1 = (CTX_PTR)AllocUnitsRare(p, 0);
      if (!c1)
        return NULL;
    }
    c1->NumStats = 1;
    *ONE_STATE(c1) = upState;
    c1->Suffix = REF(c);
    SetSuccessor(ps[--numPs], REF(c1));
    c = c1;
  }
  
  return c;
}